

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void rhash_sha256_process_block(uint *hash,uint *block)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint T1_31;
  uint T1_30;
  uint T1_29;
  uint T1_28;
  uint T1_27;
  uint T1_26;
  uint T1_25;
  uint T1_24;
  uint T1_23;
  uint T1_22;
  uint T1_21;
  uint T1_20;
  uint T1_19;
  uint T1_18;
  uint T1_17;
  uint T1_16;
  uint T1_15;
  uint T1_14;
  uint T1_13;
  uint T1_12;
  uint T1_11;
  uint T1_10;
  uint T1_9;
  uint T1_8;
  uint T1_7;
  uint T1_6;
  uint T1_5;
  uint T1_4;
  uint T1_3;
  uint T1_2;
  uint T1_1;
  uint T1;
  int i;
  uint *k;
  uint W [16];
  uint H;
  uint G;
  uint F;
  uint E;
  uint D;
  uint C;
  uint B;
  uint A;
  uint *block_local;
  uint *hash_local;
  
  uVar8 = *hash;
  uVar6 = hash[1];
  uVar12 = hash[4];
  uVar9 = hash[5];
  uVar7 = hash[6];
  uVar4 = *block;
  k._0_4_ = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  iVar1 = hash[7] + (uVar12 >> 6 ^ uVar12 << 0x1a ^ uVar12 >> 0xb ^ uVar12 << 0x15 ^
                    uVar12 >> 0x19 ^ uVar12 << 7) + (uVar7 ^ uVar12 & (uVar9 ^ uVar7)) + 0x428a2f98
          + (uint)k;
  uVar2 = iVar1 + hash[3];
  uVar3 = iVar1 + (uVar8 >> 2 ^ uVar8 << 0x1e ^ uVar8 >> 0xd ^ uVar8 << 0x13 ^
                  uVar8 >> 0x16 ^ uVar8 << 10) + (uVar8 & uVar6 ^ hash[2] & (uVar8 ^ uVar6));
  uVar4 = block[1];
  k._4_4_ = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  iVar1 = uVar7 + (uVar2 >> 6 ^ uVar2 * 0x4000000 ^ uVar2 >> 0xb ^ uVar2 * 0x200000 ^
                  uVar2 >> 0x19 ^ uVar2 * 0x80) + (uVar9 ^ uVar2 & (uVar12 ^ uVar9)) + 0x71374491 +
          k._4_4_;
  uVar4 = iVar1 + hash[2];
  uVar5 = iVar1 + (uVar3 >> 2 ^ uVar3 * 0x40000000 ^ uVar3 >> 0xd ^ uVar3 * 0x80000 ^
                  uVar3 >> 0x16 ^ uVar3 * 0x400) + (uVar3 & uVar8 ^ uVar6 & (uVar3 ^ uVar8));
  uVar7 = block[2];
  W[0] = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  iVar1 = uVar9 + (uVar4 >> 6 ^ uVar4 * 0x4000000 ^ uVar4 >> 0xb ^ uVar4 * 0x200000 ^
                  uVar4 >> 0x19 ^ uVar4 * 0x80) + (uVar12 ^ uVar4 & (uVar2 ^ uVar12)) + 0xb5c0fbcf +
          W[0];
  uVar6 = iVar1 + uVar6;
  uVar7 = iVar1 + (uVar5 >> 2 ^ uVar5 * 0x40000000 ^ uVar5 >> 0xd ^ uVar5 * 0x80000 ^
                  uVar5 >> 0x16 ^ uVar5 * 0x400) + (uVar5 & uVar3 ^ uVar8 & (uVar5 ^ uVar3));
  uVar9 = block[3];
  W[1] = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  iVar1 = uVar12 + (uVar6 >> 6 ^ uVar6 * 0x4000000 ^ uVar6 >> 0xb ^ uVar6 * 0x200000 ^
                   uVar6 >> 0x19 ^ uVar6 * 0x80) + (uVar2 ^ uVar6 & (uVar4 ^ uVar2)) + 0xe9b5dba5 +
          W[1];
  uVar8 = iVar1 + uVar8;
  uVar9 = iVar1 + (uVar7 >> 2 ^ uVar7 * 0x40000000 ^ uVar7 >> 0xd ^ uVar7 * 0x80000 ^
                  uVar7 >> 0x16 ^ uVar7 * 0x400) + (uVar7 & uVar5 ^ uVar3 & (uVar7 ^ uVar5));
  uVar12 = block[4];
  W[2] = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
  iVar1 = uVar2 + (uVar8 >> 6 ^ uVar8 * 0x4000000 ^ uVar8 >> 0xb ^ uVar8 * 0x200000 ^
                  uVar8 >> 0x19 ^ uVar8 * 0x80) + (uVar4 ^ uVar8 & (uVar6 ^ uVar4)) + 0x3956c25b +
          W[2];
  uVar3 = iVar1 + uVar3;
  uVar2 = iVar1 + (uVar9 >> 2 ^ uVar9 * 0x40000000 ^ uVar9 >> 0xd ^ uVar9 * 0x80000 ^
                  uVar9 >> 0x16 ^ uVar9 * 0x400) + (uVar9 & uVar7 ^ uVar5 & (uVar9 ^ uVar7));
  uVar12 = block[5];
  W[3] = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
  iVar1 = uVar4 + (uVar3 >> 6 ^ uVar3 * 0x4000000 ^ uVar3 >> 0xb ^ uVar3 * 0x200000 ^
                  uVar3 >> 0x19 ^ uVar3 * 0x80) + (uVar6 ^ uVar3 & (uVar8 ^ uVar6)) + 0x59f111f1 +
          W[3];
  uVar5 = iVar1 + uVar5;
  uVar4 = iVar1 + (uVar2 >> 2 ^ uVar2 * 0x40000000 ^ uVar2 >> 0xd ^ uVar2 * 0x80000 ^
                  uVar2 >> 0x16 ^ uVar2 * 0x400) + (uVar2 & uVar9 ^ uVar7 & (uVar2 ^ uVar9));
  uVar12 = block[6];
  W[4] = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
  iVar1 = uVar6 + (uVar5 >> 6 ^ uVar5 * 0x4000000 ^ uVar5 >> 0xb ^ uVar5 * 0x200000 ^
                  uVar5 >> 0x19 ^ uVar5 * 0x80) + (uVar8 ^ uVar5 & (uVar3 ^ uVar8)) + 0x923f82a4 +
          W[4];
  uVar7 = iVar1 + uVar7;
  uVar10 = iVar1 + (uVar4 >> 2 ^ uVar4 * 0x40000000 ^ uVar4 >> 0xd ^ uVar4 * 0x80000 ^
                   uVar4 >> 0x16 ^ uVar4 * 0x400) + (uVar4 & uVar2 ^ uVar9 & (uVar4 ^ uVar2));
  uVar6 = block[7];
  W[5] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  iVar1 = uVar8 + (uVar7 >> 6 ^ uVar7 * 0x4000000 ^ uVar7 >> 0xb ^ uVar7 * 0x200000 ^
                  uVar7 >> 0x19 ^ uVar7 * 0x80) + (uVar3 ^ uVar7 & (uVar5 ^ uVar3)) + 0xab1c5ed5 +
          W[5];
  uVar9 = iVar1 + uVar9;
  uVar11 = iVar1 + (uVar10 >> 2 ^ uVar10 * 0x40000000 ^ uVar10 >> 0xd ^ uVar10 * 0x80000 ^
                   uVar10 >> 0x16 ^ uVar10 * 0x400) + (uVar10 & uVar4 ^ uVar2 & (uVar10 ^ uVar4));
  uVar8 = block[8];
  W[6] = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
  iVar1 = uVar3 + (uVar9 >> 6 ^ uVar9 * 0x4000000 ^ uVar9 >> 0xb ^ uVar9 * 0x200000 ^
                  uVar9 >> 0x19 ^ uVar9 * 0x80) + (uVar5 ^ uVar9 & (uVar7 ^ uVar5)) + 0xd807aa98 +
          W[6];
  uVar2 = iVar1 + uVar2;
  uVar6 = iVar1 + (uVar11 >> 2 ^ uVar11 * 0x40000000 ^ uVar11 >> 0xd ^ uVar11 * 0x80000 ^
                  uVar11 >> 0x16 ^ uVar11 * 0x400) + (uVar11 & uVar10 ^ uVar4 & (uVar11 ^ uVar10));
  uVar8 = block[9];
  W[7] = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
  iVar1 = uVar5 + (uVar2 >> 6 ^ uVar2 * 0x4000000 ^ uVar2 >> 0xb ^ uVar2 * 0x200000 ^
                  uVar2 >> 0x19 ^ uVar2 * 0x80) + (uVar7 ^ uVar2 & (uVar9 ^ uVar7)) + 0x12835b01 +
          W[7];
  uVar4 = iVar1 + uVar4;
  uVar12 = iVar1 + (uVar6 >> 2 ^ uVar6 * 0x40000000 ^ uVar6 >> 0xd ^ uVar6 * 0x80000 ^
                   uVar6 >> 0x16 ^ uVar6 * 0x400) + (uVar6 & uVar11 ^ uVar10 & (uVar6 ^ uVar11));
  uVar8 = block[10];
  W[8] = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
  iVar1 = uVar7 + (uVar4 >> 6 ^ uVar4 * 0x4000000 ^ uVar4 >> 0xb ^ uVar4 * 0x200000 ^
                  uVar4 >> 0x19 ^ uVar4 * 0x80) + (uVar9 ^ uVar4 & (uVar2 ^ uVar9)) + 0x243185be +
          W[8];
  uVar10 = iVar1 + uVar10;
  uVar7 = iVar1 + (uVar12 >> 2 ^ uVar12 * 0x40000000 ^ uVar12 >> 0xd ^ uVar12 * 0x80000 ^
                  uVar12 >> 0x16 ^ uVar12 * 0x400) + (uVar12 & uVar6 ^ uVar11 & (uVar12 ^ uVar6));
  uVar8 = block[0xb];
  W[9] = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
  iVar1 = uVar9 + (uVar10 >> 6 ^ uVar10 * 0x4000000 ^ uVar10 >> 0xb ^ uVar10 * 0x200000 ^
                  uVar10 >> 0x19 ^ uVar10 * 0x80) + (uVar2 ^ uVar10 & (uVar4 ^ uVar2)) + 0x550c7dc3
          + W[9];
  uVar11 = iVar1 + uVar11;
  uVar9 = iVar1 + (uVar7 >> 2 ^ uVar7 * 0x40000000 ^ uVar7 >> 0xd ^ uVar7 * 0x80000 ^
                  uVar7 >> 0x16 ^ uVar7 * 0x400) + (uVar7 & uVar12 ^ uVar6 & (uVar7 ^ uVar12));
  uVar8 = block[0xc];
  W[10] = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
  iVar1 = uVar2 + (uVar11 >> 6 ^ uVar11 * 0x4000000 ^ uVar11 >> 0xb ^ uVar11 * 0x200000 ^
                  uVar11 >> 0x19 ^ uVar11 * 0x80) + (uVar4 ^ uVar11 & (uVar10 ^ uVar4)) + 0x72be5d74
          + W[10];
  W[0xe] = iVar1 + uVar6;
  F = iVar1 + (uVar9 >> 2 ^ uVar9 * 0x40000000 ^ uVar9 >> 0xd ^ uVar9 * 0x80000 ^
              uVar9 >> 0x16 ^ uVar9 * 0x400) + (uVar9 & uVar7 ^ uVar12 & (uVar9 ^ uVar7));
  uVar8 = block[0xd];
  W[0xb] = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
  iVar1 = uVar4 + (W[0xe] >> 6 ^ W[0xe] * 0x4000000 ^ W[0xe] >> 0xb ^ W[0xe] * 0x200000 ^
                  W[0xe] >> 0x19 ^ W[0xe] * 0x80) + (uVar10 ^ W[0xe] & (uVar11 ^ uVar10)) +
          0x80deb1fe + W[0xb];
  W[0xf] = iVar1 + uVar12;
  E = iVar1 + (F >> 2 ^ F * 0x40000000 ^ F >> 0xd ^ F * 0x80000 ^ F >> 0x16 ^ F * 0x400) +
      (F & uVar9 ^ uVar7 & (F ^ uVar9));
  uVar8 = block[0xe];
  W[0xc] = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
  iVar1 = uVar10 + (W[0xf] >> 6 ^ W[0xf] * 0x4000000 ^ W[0xf] >> 0xb ^ W[0xf] * 0x200000 ^
                   W[0xf] >> 0x19 ^ W[0xf] * 0x80) + (uVar11 ^ W[0xf] & (W[0xe] ^ uVar11)) +
          0x9bdc06a7 + W[0xc];
  H = iVar1 + uVar7;
  D = iVar1 + (E >> 2 ^ E * 0x40000000 ^ E >> 0xd ^ E * 0x80000 ^ E >> 0x16 ^ E * 0x400) +
      (E & F ^ uVar9 & (E ^ F));
  uVar8 = block[0xf];
  W[0xd] = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
  iVar1 = uVar11 + (H >> 6 ^ H * 0x4000000 ^ H >> 0xb ^ H * 0x200000 ^ H >> 0x19 ^ H * 0x80) +
          (W[0xe] ^ H & (W[0xf] ^ W[0xe])) + 0xc19bf174 + W[0xd];
  G = iVar1 + uVar9;
  C = iVar1 + (D >> 2 ^ D * 0x40000000 ^ D >> 0xd ^ D * 0x80000 ^ D >> 0x16 ^ D * 0x400) +
      (D & E ^ F & (D ^ E));
  _T1 = rhash_k256;
  for (T1_1 = 0x10; _T1 = _T1 + 0x10, (int)T1_1 < 0x40; T1_1 = T1_1 + 0x10) {
    k._0_4_ = (W[0xc] >> 0x11 ^ W[0xc] << 0xf ^ W[0xc] >> 0x13 ^ W[0xc] << 0xd ^ W[0xc] >> 10) +
              W[7] + (k._4_4_ >> 7 ^ k._4_4_ << 0x19 ^ k._4_4_ >> 0x12 ^ k._4_4_ << 0xe ^
                     k._4_4_ >> 3) + (uint)k;
    iVar1 = W[0xe] + (G >> 6 ^ G << 0x1a ^ G >> 0xb ^ G << 0x15 ^ G >> 0x19 ^ G << 7) +
            (W[0xf] ^ G & (H ^ W[0xf])) + *_T1 + (uint)k;
    uVar8 = iVar1 + F;
    uVar7 = iVar1 + (C >> 2 ^ C << 0x1e ^ C >> 0xd ^ C << 0x13 ^ C >> 0x16 ^ C << 10) +
            (C & D ^ E & (C ^ D));
    k._4_4_ = (W[0xd] >> 0x11 ^ W[0xd] << 0xf ^ W[0xd] >> 0x13 ^ W[0xd] << 0xd ^ W[0xd] >> 10) +
              W[8] + (W[0] >> 7 ^ W[0] << 0x19 ^ W[0] >> 0x12 ^ W[0] << 0xe ^ W[0] >> 3) + k._4_4_;
    iVar1 = W[0xf] + (uVar8 >> 6 ^ uVar8 * 0x4000000 ^ uVar8 >> 0xb ^ uVar8 * 0x200000 ^
                     uVar8 >> 0x19 ^ uVar8 * 0x80) + (H ^ uVar8 & (G ^ H)) + _T1[1] + k._4_4_;
    uVar6 = iVar1 + E;
    uVar4 = iVar1 + (uVar7 >> 2 ^ uVar7 * 0x40000000 ^ uVar7 >> 0xd ^ uVar7 * 0x80000 ^
                    uVar7 >> 0x16 ^ uVar7 * 0x400) + (uVar7 & C ^ D & (uVar7 ^ C));
    W[0] = ((uint)k >> 0x11 ^ (uint)k * 0x8000 ^ (uint)k >> 0x13 ^ (uint)k * 0x2000 ^ (uint)k >> 10)
           + W[9] + (W[1] >> 7 ^ W[1] << 0x19 ^ W[1] >> 0x12 ^ W[1] << 0xe ^ W[1] >> 3) + W[0];
    iVar1 = H + (uVar6 >> 6 ^ uVar6 * 0x4000000 ^ uVar6 >> 0xb ^ uVar6 * 0x200000 ^
                uVar6 >> 0x19 ^ uVar6 * 0x80) + (G ^ uVar6 & (uVar8 ^ G)) + _T1[2] + W[0];
    uVar12 = iVar1 + D;
    uVar2 = iVar1 + (uVar4 >> 2 ^ uVar4 * 0x40000000 ^ uVar4 >> 0xd ^ uVar4 * 0x80000 ^
                    uVar4 >> 0x16 ^ uVar4 * 0x400) + (uVar4 & uVar7 ^ C & (uVar4 ^ uVar7));
    W[1] = (k._4_4_ >> 0x11 ^ k._4_4_ * 0x8000 ^ k._4_4_ >> 0x13 ^ k._4_4_ * 0x2000 ^ k._4_4_ >> 10)
           + W[10] + (W[2] >> 7 ^ W[2] << 0x19 ^ W[2] >> 0x12 ^ W[2] << 0xe ^ W[2] >> 3) + W[1];
    iVar1 = G + (uVar12 >> 6 ^ uVar12 * 0x4000000 ^ uVar12 >> 0xb ^ uVar12 * 0x200000 ^
                uVar12 >> 0x19 ^ uVar12 * 0x80) + (uVar8 ^ uVar12 & (uVar6 ^ uVar8)) + _T1[3] + W[1]
    ;
    uVar9 = iVar1 + C;
    uVar3 = iVar1 + (uVar2 >> 2 ^ uVar2 * 0x40000000 ^ uVar2 >> 0xd ^ uVar2 * 0x80000 ^
                    uVar2 >> 0x16 ^ uVar2 * 0x400) + (uVar2 & uVar4 ^ uVar7 & (uVar2 ^ uVar4));
    W[2] = (W[0] >> 0x11 ^ W[0] * 0x8000 ^ W[0] >> 0x13 ^ W[0] * 0x2000 ^ W[0] >> 10) + W[0xb] +
           (W[3] >> 7 ^ W[3] << 0x19 ^ W[3] >> 0x12 ^ W[3] << 0xe ^ W[3] >> 3) + W[2];
    iVar1 = uVar8 + (uVar9 >> 6 ^ uVar9 * 0x4000000 ^ uVar9 >> 0xb ^ uVar9 * 0x200000 ^
                    uVar9 >> 0x19 ^ uVar9 * 0x80) + (uVar6 ^ uVar9 & (uVar12 ^ uVar6)) + _T1[4] +
            W[2];
    uVar7 = iVar1 + uVar7;
    uVar8 = iVar1 + (uVar3 >> 2 ^ uVar3 * 0x40000000 ^ uVar3 >> 0xd ^ uVar3 * 0x80000 ^
                    uVar3 >> 0x16 ^ uVar3 * 0x400) + (uVar3 & uVar2 ^ uVar4 & (uVar3 ^ uVar2));
    W[3] = (W[1] >> 0x11 ^ W[1] * 0x8000 ^ W[1] >> 0x13 ^ W[1] * 0x2000 ^ W[1] >> 10) + W[0xc] +
           (W[4] >> 7 ^ W[4] << 0x19 ^ W[4] >> 0x12 ^ W[4] << 0xe ^ W[4] >> 3) + W[3];
    iVar1 = uVar6 + (uVar7 >> 6 ^ uVar7 * 0x4000000 ^ uVar7 >> 0xb ^ uVar7 * 0x200000 ^
                    uVar7 >> 0x19 ^ uVar7 * 0x80) + (uVar12 ^ uVar7 & (uVar9 ^ uVar12)) + _T1[5] +
            W[3];
    uVar4 = iVar1 + uVar4;
    uVar5 = iVar1 + (uVar8 >> 2 ^ uVar8 * 0x40000000 ^ uVar8 >> 0xd ^ uVar8 * 0x80000 ^
                    uVar8 >> 0x16 ^ uVar8 * 0x400) + (uVar8 & uVar3 ^ uVar2 & (uVar8 ^ uVar3));
    W[4] = (W[2] >> 0x11 ^ W[2] * 0x8000 ^ W[2] >> 0x13 ^ W[2] * 0x2000 ^ W[2] >> 10) + W[0xd] +
           (W[5] >> 7 ^ W[5] << 0x19 ^ W[5] >> 0x12 ^ W[5] << 0xe ^ W[5] >> 3) + W[4];
    iVar1 = uVar12 + (uVar4 >> 6 ^ uVar4 * 0x4000000 ^ uVar4 >> 0xb ^ uVar4 * 0x200000 ^
                     uVar4 >> 0x19 ^ uVar4 * 0x80) + (uVar9 ^ uVar4 & (uVar7 ^ uVar9)) + _T1[6] +
            W[4];
    uVar2 = iVar1 + uVar2;
    uVar10 = iVar1 + (uVar5 >> 2 ^ uVar5 * 0x40000000 ^ uVar5 >> 0xd ^ uVar5 * 0x80000 ^
                     uVar5 >> 0x16 ^ uVar5 * 0x400) + (uVar5 & uVar8 ^ uVar3 & (uVar5 ^ uVar8));
    W[5] = (W[3] >> 0x11 ^ W[3] * 0x8000 ^ W[3] >> 0x13 ^ W[3] * 0x2000 ^ W[3] >> 10) + (uint)k +
           (W[6] >> 7 ^ W[6] << 0x19 ^ W[6] >> 0x12 ^ W[6] << 0xe ^ W[6] >> 3) + W[5];
    iVar1 = uVar9 + (uVar2 >> 6 ^ uVar2 * 0x4000000 ^ uVar2 >> 0xb ^ uVar2 * 0x200000 ^
                    uVar2 >> 0x19 ^ uVar2 * 0x80) + (uVar7 ^ uVar2 & (uVar4 ^ uVar7)) + _T1[7] +
            W[5];
    uVar3 = iVar1 + uVar3;
    uVar11 = iVar1 + (uVar10 >> 2 ^ uVar10 * 0x40000000 ^ uVar10 >> 0xd ^ uVar10 * 0x80000 ^
                     uVar10 >> 0x16 ^ uVar10 * 0x400) + (uVar10 & uVar5 ^ uVar8 & (uVar10 ^ uVar5));
    W[6] = (W[4] >> 0x11 ^ W[4] * 0x8000 ^ W[4] >> 0x13 ^ W[4] * 0x2000 ^ W[4] >> 10) + k._4_4_ +
           (W[7] >> 7 ^ W[7] << 0x19 ^ W[7] >> 0x12 ^ W[7] << 0xe ^ W[7] >> 3) + W[6];
    iVar1 = uVar7 + (uVar3 >> 6 ^ uVar3 * 0x4000000 ^ uVar3 >> 0xb ^ uVar3 * 0x200000 ^
                    uVar3 >> 0x19 ^ uVar3 * 0x80) + (uVar4 ^ uVar3 & (uVar2 ^ uVar4)) + _T1[8] +
            W[6];
    uVar8 = iVar1 + uVar8;
    uVar6 = iVar1 + (uVar11 >> 2 ^ uVar11 * 0x40000000 ^ uVar11 >> 0xd ^ uVar11 * 0x80000 ^
                    uVar11 >> 0x16 ^ uVar11 * 0x400) + (uVar11 & uVar10 ^ uVar5 & (uVar11 ^ uVar10))
    ;
    W[7] = (W[5] >> 0x11 ^ W[5] * 0x8000 ^ W[5] >> 0x13 ^ W[5] * 0x2000 ^ W[5] >> 10) + W[0] +
           (W[8] >> 7 ^ W[8] << 0x19 ^ W[8] >> 0x12 ^ W[8] << 0xe ^ W[8] >> 3) + W[7];
    iVar1 = uVar4 + (uVar8 >> 6 ^ uVar8 * 0x4000000 ^ uVar8 >> 0xb ^ uVar8 * 0x200000 ^
                    uVar8 >> 0x19 ^ uVar8 * 0x80) + (uVar2 ^ uVar8 & (uVar3 ^ uVar2)) + _T1[9] +
            W[7];
    uVar5 = iVar1 + uVar5;
    uVar12 = iVar1 + (uVar6 >> 2 ^ uVar6 * 0x40000000 ^ uVar6 >> 0xd ^ uVar6 * 0x80000 ^
                     uVar6 >> 0x16 ^ uVar6 * 0x400) + (uVar6 & uVar11 ^ uVar10 & (uVar6 ^ uVar11));
    W[8] = (W[6] >> 0x11 ^ W[6] * 0x8000 ^ W[6] >> 0x13 ^ W[6] * 0x2000 ^ W[6] >> 10) + W[1] +
           (W[9] >> 7 ^ W[9] << 0x19 ^ W[9] >> 0x12 ^ W[9] << 0xe ^ W[9] >> 3) + W[8];
    iVar1 = uVar2 + (uVar5 >> 6 ^ uVar5 * 0x4000000 ^ uVar5 >> 0xb ^ uVar5 * 0x200000 ^
                    uVar5 >> 0x19 ^ uVar5 * 0x80) + (uVar3 ^ uVar5 & (uVar8 ^ uVar3)) + _T1[10] +
            W[8];
    uVar10 = iVar1 + uVar10;
    uVar9 = iVar1 + (uVar12 >> 2 ^ uVar12 * 0x40000000 ^ uVar12 >> 0xd ^ uVar12 * 0x80000 ^
                    uVar12 >> 0x16 ^ uVar12 * 0x400) + (uVar12 & uVar6 ^ uVar11 & (uVar12 ^ uVar6));
    W[9] = (W[7] >> 0x11 ^ W[7] * 0x8000 ^ W[7] >> 0x13 ^ W[7] * 0x2000 ^ W[7] >> 10) + W[2] +
           (W[10] >> 7 ^ W[10] << 0x19 ^ W[10] >> 0x12 ^ W[10] << 0xe ^ W[10] >> 3) + W[9];
    iVar1 = uVar3 + (uVar10 >> 6 ^ uVar10 * 0x4000000 ^ uVar10 >> 0xb ^ uVar10 * 0x200000 ^
                    uVar10 >> 0x19 ^ uVar10 * 0x80) + (uVar8 ^ uVar10 & (uVar5 ^ uVar8)) + _T1[0xb]
            + W[9];
    uVar11 = iVar1 + uVar11;
    uVar7 = iVar1 + (uVar9 >> 2 ^ uVar9 * 0x40000000 ^ uVar9 >> 0xd ^ uVar9 * 0x80000 ^
                    uVar9 >> 0x16 ^ uVar9 * 0x400) + (uVar9 & uVar12 ^ uVar6 & (uVar9 ^ uVar12));
    W[10] = (W[8] >> 0x11 ^ W[8] * 0x8000 ^ W[8] >> 0x13 ^ W[8] * 0x2000 ^ W[8] >> 10) + W[3] +
            (W[0xb] >> 7 ^ W[0xb] << 0x19 ^ W[0xb] >> 0x12 ^ W[0xb] << 0xe ^ W[0xb] >> 3) + W[10];
    iVar1 = uVar8 + (uVar11 >> 6 ^ uVar11 * 0x4000000 ^ uVar11 >> 0xb ^ uVar11 * 0x200000 ^
                    uVar11 >> 0x19 ^ uVar11 * 0x80) + (uVar5 ^ uVar11 & (uVar10 ^ uVar5)) + _T1[0xc]
            + W[10];
    W[0xe] = iVar1 + uVar6;
    F = iVar1 + (uVar7 >> 2 ^ uVar7 * 0x40000000 ^ uVar7 >> 0xd ^ uVar7 * 0x80000 ^
                uVar7 >> 0x16 ^ uVar7 * 0x400) + (uVar7 & uVar9 ^ uVar12 & (uVar7 ^ uVar9));
    W[0xb] = (W[9] >> 0x11 ^ W[9] * 0x8000 ^ W[9] >> 0x13 ^ W[9] * 0x2000 ^ W[9] >> 10) + W[4] +
             (W[0xc] >> 7 ^ W[0xc] << 0x19 ^ W[0xc] >> 0x12 ^ W[0xc] << 0xe ^ W[0xc] >> 3) + W[0xb];
    iVar1 = uVar5 + (W[0xe] >> 6 ^ W[0xe] * 0x4000000 ^ W[0xe] >> 0xb ^ W[0xe] * 0x200000 ^
                    W[0xe] >> 0x19 ^ W[0xe] * 0x80) + (uVar10 ^ W[0xe] & (uVar11 ^ uVar10)) +
            _T1[0xd] + W[0xb];
    W[0xf] = iVar1 + uVar12;
    E = iVar1 + (F >> 2 ^ F * 0x40000000 ^ F >> 0xd ^ F * 0x80000 ^ F >> 0x16 ^ F * 0x400) +
        (F & uVar7 ^ uVar9 & (F ^ uVar7));
    W[0xc] = (W[10] >> 0x11 ^ W[10] * 0x8000 ^ W[10] >> 0x13 ^ W[10] * 0x2000 ^ W[10] >> 10) + W[5]
             + (W[0xd] >> 7 ^ W[0xd] << 0x19 ^ W[0xd] >> 0x12 ^ W[0xd] << 0xe ^ W[0xd] >> 3) +
             W[0xc];
    iVar1 = uVar10 + (W[0xf] >> 6 ^ W[0xf] * 0x4000000 ^ W[0xf] >> 0xb ^ W[0xf] * 0x200000 ^
                     W[0xf] >> 0x19 ^ W[0xf] * 0x80) + (uVar11 ^ W[0xf] & (W[0xe] ^ uVar11)) +
            _T1[0xe] + W[0xc];
    H = iVar1 + uVar9;
    D = iVar1 + (E >> 2 ^ E * 0x40000000 ^ E >> 0xd ^ E * 0x80000 ^ E >> 0x16 ^ E * 0x400) +
        (E & F ^ uVar7 & (E ^ F));
    W[0xd] = (W[0xb] >> 0x11 ^ W[0xb] * 0x8000 ^ W[0xb] >> 0x13 ^ W[0xb] * 0x2000 ^ W[0xb] >> 10) +
             W[6] + ((uint)k >> 7 ^ (uint)k * 0x2000000 ^ (uint)k >> 0x12 ^ (uint)k * 0x4000 ^
                    (uint)k >> 3) + W[0xd];
    iVar1 = uVar11 + (H >> 6 ^ H * 0x4000000 ^ H >> 0xb ^ H * 0x200000 ^ H >> 0x19 ^ H * 0x80) +
            (W[0xe] ^ H & (W[0xf] ^ W[0xe])) + _T1[0xf] + W[0xd];
    G = iVar1 + uVar7;
    C = iVar1 + (D >> 2 ^ D * 0x40000000 ^ D >> 0xd ^ D * 0x80000 ^ D >> 0x16 ^ D * 0x400) +
        (D & E ^ F & (D ^ E));
  }
  *hash = C + *hash;
  hash[1] = D + hash[1];
  hash[2] = E + hash[2];
  hash[3] = F + hash[3];
  hash[4] = G + hash[4];
  hash[5] = H + hash[5];
  hash[6] = W[0xf] + hash[6];
  hash[7] = W[0xe] + hash[7];
  return;
}

Assistant:

static void rhash_sha256_process_block(unsigned hash[8], unsigned block[16])
{
	unsigned A, B, C, D, E, F, G, H;
	unsigned W[16];
	const unsigned *k;
	int i;

	A = hash[0], B = hash[1], C = hash[2], D = hash[3];
	E = hash[4], F = hash[5], G = hash[6], H = hash[7];

	/* Compute SHA using alternate Method: FIPS 180-3 6.1.3 */
	ROUND_1_16(A, B, C, D, E, F, G, H, 0);
	ROUND_1_16(H, A, B, C, D, E, F, G, 1);
	ROUND_1_16(G, H, A, B, C, D, E, F, 2);
	ROUND_1_16(F, G, H, A, B, C, D, E, 3);
	ROUND_1_16(E, F, G, H, A, B, C, D, 4);
	ROUND_1_16(D, E, F, G, H, A, B, C, 5);
	ROUND_1_16(C, D, E, F, G, H, A, B, 6);
	ROUND_1_16(B, C, D, E, F, G, H, A, 7);
	ROUND_1_16(A, B, C, D, E, F, G, H, 8);
	ROUND_1_16(H, A, B, C, D, E, F, G, 9);
	ROUND_1_16(G, H, A, B, C, D, E, F, 10);
	ROUND_1_16(F, G, H, A, B, C, D, E, 11);
	ROUND_1_16(E, F, G, H, A, B, C, D, 12);
	ROUND_1_16(D, E, F, G, H, A, B, C, 13);
	ROUND_1_16(C, D, E, F, G, H, A, B, 14);
	ROUND_1_16(B, C, D, E, F, G, H, A, 15);

	for (i = 16, k = &rhash_k256[16]; i < 64; i += 16, k += 16) {
		ROUND_17_64(A, B, C, D, E, F, G, H,  0);
		ROUND_17_64(H, A, B, C, D, E, F, G,  1);
		ROUND_17_64(G, H, A, B, C, D, E, F,  2);
		ROUND_17_64(F, G, H, A, B, C, D, E,  3);
		ROUND_17_64(E, F, G, H, A, B, C, D,  4);
		ROUND_17_64(D, E, F, G, H, A, B, C,  5);
		ROUND_17_64(C, D, E, F, G, H, A, B,  6);
		ROUND_17_64(B, C, D, E, F, G, H, A,  7);
		ROUND_17_64(A, B, C, D, E, F, G, H,  8);
		ROUND_17_64(H, A, B, C, D, E, F, G,  9);
		ROUND_17_64(G, H, A, B, C, D, E, F, 10);
		ROUND_17_64(F, G, H, A, B, C, D, E, 11);
		ROUND_17_64(E, F, G, H, A, B, C, D, 12);
		ROUND_17_64(D, E, F, G, H, A, B, C, 13);
		ROUND_17_64(C, D, E, F, G, H, A, B, 14);
		ROUND_17_64(B, C, D, E, F, G, H, A, 15);
	}

	hash[0] += A, hash[1] += B, hash[2] += C, hash[3] += D;
	hash[4] += E, hash[5] += F, hash[6] += G, hash[7] += H;
}